

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int CollectionRecordArrayWalker(jx9_value *pKey,jx9_value *pData,void *pUserData)

{
  int iVar1;
  unqlite_col *pCol;
  
  iVar1 = CollectionStore((unqlite_col *)pUserData,pData);
  return iVar1;
}

Assistant:

static int CollectionRecordArrayWalker(jx9_value *pKey,jx9_value *pData,void *pUserData)
{
	unqlite_col *pCol = (unqlite_col *)pUserData;
	int rc;
	/* Perform the insertion */
	rc = CollectionStore(pCol,pData);
	if( rc != UNQLITE_OK ){
		SXUNUSED(pKey); /* cc warning */
	}
	return rc;
}